

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O0

uint8_t * ogt_vox_write_scene(ogt_vox_scene *scene,uint32_t *buffer_size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ogt_vox_layer *poVar14;
  bool bVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  ogt_vox_instance *poVar18;
  ogt_vox_cam *poVar19;
  ogt_vox_matl *poVar20;
  ulong uVar21;
  uint32_t *main_chunk_child_size;
  uint8_t *buffer_data;
  uint32_t local_690;
  uint32_t chunk_size_4;
  uint32_t offset_of_chunk_header_4;
  uint32_t layer_dict_keyvalue_count;
  char *hidden_string_1;
  char *layer_name_string;
  char color_string [64];
  uint32_t i_6;
  uint32_t chunk_size_3;
  uint32_t offset_of_chunk_header_3;
  uint32_t matl_dict_keyvalue_count;
  ogt_vox_matl *matl;
  int32_t i_5;
  uint32_t i_4;
  ogt_vox_palette rotated_palette;
  uint32_t chunk_size_2;
  uint32_t offset_of_chunk_header_2;
  char *cam_mode;
  char cam_fov [32];
  char cam_frustum [32];
  char cam_radius [32];
  char cam_angle [64];
  char cam_focus [64];
  ogt_vox_cam *camera;
  uint32_t i_3;
  uint32_t child_node_id;
  uint32_t node_id;
  ogt_vox_instance *instance_1;
  uint32_t i_2;
  uint32_t chunk_size_1;
  uint32_t j;
  uint32_t node_dict_keyvalue_count;
  char *loop_string;
  ogt_vox_instance *poStack_e0;
  uint32_t offset_of_chunk_header_1;
  ogt_vox_instance *instance;
  uint32_t i_1;
  uint32_t chunk_size;
  uint32_t child_instance_index_1;
  uint32_t child_group_index_1;
  uint32_t offset_of_chunk_header;
  uint32_t group_dict_keyvalue_count;
  char *hidden_string;
  uint32_t child_instance_index;
  uint32_t child_group_index;
  uint32_t num_child_nodes;
  uint32_t group_index_1;
  ogt_vox_group *group;
  int local_98;
  uint32_t group_index;
  uint32_t first_instance_transform_node_id;
  uint32_t first_shape_node_id;
  uint32_t first_group_node_id;
  uint32_t first_group_transform_node_id;
  uint local_80;
  uint8_t uStack_7c;
  uint8_t color_index;
  uint32_t x;
  uint32_t y;
  uint32_t z;
  uint32_t voxel_index;
  uint32_t chunk_size_xyzi;
  uint32_t voxel_index_1;
  uint32_t num_solid_voxels;
  uint32_t num_voxels_in_grid;
  ogt_vox_model *model;
  uint32_t i;
  uint32_t offset_post_main_chunk;
  _vox_file_writeable *fp;
  undefined1 local_38 [8];
  _vox_file_writeable file;
  uint32_t *buffer_size_local;
  ogt_vox_scene *scene_local;
  
  file.data.count = (size_t)buffer_size;
  _vox_file_writeable::_vox_file_writeable((_vox_file_writeable *)local_38);
  _vox_file_writeable_init((_vox_file_writeable *)local_38);
  _i = (_vox_file_writeable *)local_38;
  _vox_file_write_uint32(_i,0x20584f56);
  _vox_file_write_uint32(_i,0x96);
  _vox_file_write_uint32(_i,0x4e49414d);
  _vox_file_write_uint32(_i,0);
  _vox_file_write_uint32(_i,0);
  model._4_4_ = _vox_file_get_offset(_i);
  model._0_4_ = 0;
  do {
    if (scene->num_models <= (uint)model) {
      if (scene->num_groups == 0) {
        __assert_fail("(scene->num_groups > 0) && (\"no groups found in scene\")",
                      "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                      ,0x9a2,"uint8_t *ogt_vox_write_scene(const ogt_vox_scene *, uint32_t *)");
      }
      first_shape_node_id = 0;
      first_instance_transform_node_id = scene->num_groups;
      group_index = first_instance_transform_node_id + scene->num_groups;
      local_98 = group_index + scene->num_instances;
      for (group._4_4_ = 0; group._4_4_ < scene->num_groups; group._4_4_ = group._4_4_ + 1) {
        _num_child_nodes = scene->groups + group._4_4_;
        _vox_file_write_chunk_nTRN
                  (_i,first_shape_node_id + group._4_4_,
                   first_instance_transform_node_id + group._4_4_,_num_child_nodes->name,
                   (bool)(_num_child_nodes->hidden & 1),&_num_child_nodes->transform,
                   _num_child_nodes->layer_index,&_num_child_nodes->transform_anim);
      }
      for (child_group_index = 0; child_group_index < scene->num_groups;
          child_group_index = child_group_index + 1) {
        child_instance_index = 0;
        for (hidden_string._4_4_ = 0; hidden_string._4_4_ < scene->num_groups;
            hidden_string._4_4_ = hidden_string._4_4_ + 1) {
          if (scene->groups[hidden_string._4_4_].parent_group_index == child_group_index) {
            child_instance_index = child_instance_index + 1;
          }
        }
        for (hidden_string._0_4_ = 0; (uint)hidden_string < scene->num_instances;
            hidden_string._0_4_ = (uint)hidden_string + 1) {
          if (scene->instances[(uint)hidden_string].group_index == child_group_index) {
            child_instance_index = child_instance_index + 1;
          }
        }
        _offset_of_chunk_header = (char *)0x0;
        if ((scene->groups[child_group_index].hidden & 1U) != 0) {
          _offset_of_chunk_header = "1";
        }
        child_group_index_1 = (uint32_t)(_offset_of_chunk_header != (char *)0x0);
        child_instance_index_1 = _vox_file_get_offset(_i);
        _vox_file_write_uint32(_i,0x5052476e);
        _vox_file_write_uint32(_i,0);
        _vox_file_write_uint32(_i,0);
        _vox_file_write_uint32(_i,first_instance_transform_node_id + child_group_index);
        _vox_file_write_uint32(_i,child_group_index_1);
        _vox_file_write_dict_key_value(_i,"_hidden",_offset_of_chunk_header);
        _vox_file_write_uint32(_i,child_instance_index);
        for (chunk_size = 0; chunk_size < scene->num_groups; chunk_size = chunk_size + 1) {
          if (scene->groups[chunk_size].parent_group_index == child_group_index) {
            _vox_file_write_uint32(_i,first_shape_node_id + chunk_size);
          }
        }
        for (i_1 = 0; i_1 < scene->num_instances; i_1 = i_1 + 1) {
          if (scene->instances[i_1].group_index == child_group_index) {
            _vox_file_write_uint32(_i,local_98 + i_1);
          }
        }
        uVar16 = _vox_file_get_offset(_i);
        instance._4_4_ = (uVar16 - child_instance_index_1) + -0xc;
        _vox_file_write_uint32_at_offset
                  (_i,child_instance_index_1 + 4,(uint32_t *)((long)&instance + 4));
      }
      for (instance._0_4_ = 0; (uint)instance < scene->num_instances;
          instance._0_4_ = (uint)instance + 1) {
        poStack_e0 = scene->instances + (uint)instance;
        loop_string._4_4_ = _vox_file_get_offset(_i);
        _vox_file_write_uint32(_i,0x5048536e);
        _vox_file_write_uint32(_i,0);
        _vox_file_write_uint32(_i,0);
        _vox_file_write_uint32(_i,group_index + (uint)instance);
        _j = (char *)0x0;
        if (((poStack_e0->model_anim).loop & 1U) != 0) {
          _j = "1";
        }
        chunk_size_1 = (uint32_t)(_j != (char *)0x0);
        _vox_file_write_uint32(_i,chunk_size_1);
        _vox_file_write_dict_key_value(_i,"_loop",_j);
        if ((poStack_e0->model_anim).num_keyframes == 0) {
          _vox_file_write_uint32(_i,1);
          _vox_file_write_uint32(_i,poStack_e0->model_index);
          _vox_file_write_uint32(_i,0);
        }
        else {
          _vox_file_write_uint32(_i,(poStack_e0->model_anim).num_keyframes);
          for (i_2 = 0; i_2 < (poStack_e0->model_anim).num_keyframes; i_2 = i_2 + 1) {
            _vox_file_write_uint32(_i,(poStack_e0->model_anim).keyframes[i_2].model_index);
            _vox_file_write_uint32(_i,1);
            _vox_file_write_dict_key_value_uint32
                      (_i,"_f",(poStack_e0->model_anim).keyframes[i_2].frame_index);
          }
        }
        uVar16 = _vox_file_get_offset(_i);
        instance_1._4_4_ = (uVar16 - loop_string._4_4_) + -0xc;
        _vox_file_write_uint32_at_offset
                  (_i,loop_string._4_4_ + 4,(uint32_t *)((long)&instance_1 + 4));
      }
      for (instance_1._0_4_ = 0; (uint)instance_1 < scene->num_instances;
          instance_1._0_4_ = (uint)instance_1 + 1) {
        poVar18 = scene->instances + (uint)instance_1;
        _vox_file_write_chunk_nTRN
                  (_i,local_98 + (uint)instance_1,group_index + (uint)instance_1,poVar18->name,
                   (bool)(poVar18->hidden & 1),&poVar18->transform,poVar18->layer_index,
                   &poVar18->transform_anim);
      }
      for (camera._4_4_ = 0; camera._4_4_ < scene->num_cameras; camera._4_4_ = camera._4_4_ + 1) {
        poVar19 = scene->cameras + camera._4_4_;
        cam_angle[0x38] = '\0';
        cam_angle[0x39] = '\0';
        cam_angle[0x3a] = '\0';
        cam_angle[0x3b] = '\0';
        cam_angle[0x3c] = '\0';
        cam_angle[0x3d] = '\0';
        cam_angle[0x3e] = '\0';
        cam_angle[0x3f] = '\0';
        cam_angle[0x28] = '\0';
        cam_angle[0x29] = '\0';
        cam_angle[0x2a] = '\0';
        cam_angle[0x2b] = '\0';
        cam_angle[0x2c] = '\0';
        cam_angle[0x2d] = '\0';
        cam_angle[0x2e] = '\0';
        cam_angle[0x2f] = '\0';
        cam_angle[0x30] = '\0';
        cam_angle[0x31] = '\0';
        cam_angle[0x32] = '\0';
        cam_angle[0x33] = '\0';
        cam_angle[0x34] = '\0';
        cam_angle[0x35] = '\0';
        cam_angle[0x36] = '\0';
        cam_angle[0x37] = '\0';
        cam_angle[0x18] = '\0';
        cam_angle[0x19] = '\0';
        cam_angle[0x1a] = '\0';
        cam_angle[0x1b] = '\0';
        cam_angle[0x1c] = '\0';
        cam_angle[0x1d] = '\0';
        cam_angle[0x1e] = '\0';
        cam_angle[0x1f] = '\0';
        cam_angle[0x20] = '\0';
        cam_angle[0x21] = '\0';
        cam_angle[0x22] = '\0';
        cam_angle[0x23] = '\0';
        cam_angle[0x24] = '\0';
        cam_angle[0x25] = '\0';
        cam_angle[0x26] = '\0';
        cam_angle[0x27] = '\0';
        cam_angle[8] = '\0';
        cam_angle[9] = '\0';
        cam_angle[10] = '\0';
        cam_angle[0xb] = '\0';
        cam_angle[0xc] = '\0';
        cam_angle[0xd] = '\0';
        cam_angle[0xe] = '\0';
        cam_angle[0xf] = '\0';
        cam_angle[0x10] = '\0';
        cam_angle[0x11] = '\0';
        cam_angle[0x12] = '\0';
        cam_angle[0x13] = '\0';
        cam_angle[0x14] = '\0';
        cam_angle[0x15] = '\0';
        cam_angle[0x16] = '\0';
        cam_angle[0x17] = '\0';
        cam_radius[0x18] = '\0';
        cam_radius[0x19] = '\0';
        cam_radius[0x1a] = '\0';
        cam_radius[0x1b] = '\0';
        cam_radius[0x1c] = '\0';
        cam_radius[0x1d] = '\0';
        cam_radius[0x1e] = '\0';
        cam_radius[0x1f] = '\0';
        cam_angle[0] = '\0';
        cam_angle[1] = '\0';
        cam_angle[2] = '\0';
        cam_angle[3] = '\0';
        cam_angle[4] = '\0';
        cam_angle[5] = '\0';
        cam_angle[6] = '\0';
        cam_angle[7] = '\0';
        cam_radius[8] = '\0';
        cam_radius[9] = '\0';
        cam_radius[10] = '\0';
        cam_radius[0xb] = '\0';
        cam_radius[0xc] = '\0';
        cam_radius[0xd] = '\0';
        cam_radius[0xe] = '\0';
        cam_radius[0xf] = '\0';
        cam_radius[0x10] = '\0';
        cam_radius[0x11] = '\0';
        cam_radius[0x12] = '\0';
        cam_radius[0x13] = '\0';
        cam_radius[0x14] = '\0';
        cam_radius[0x15] = '\0';
        cam_radius[0x16] = '\0';
        cam_radius[0x17] = '\0';
        cam_frustum[0x18] = '\0';
        cam_frustum[0x19] = '\0';
        cam_frustum[0x1a] = '\0';
        cam_frustum[0x1b] = '\0';
        cam_frustum[0x1c] = '\0';
        cam_frustum[0x1d] = '\0';
        cam_frustum[0x1e] = '\0';
        cam_frustum[0x1f] = '\0';
        cam_radius[0] = '\0';
        cam_radius[1] = '\0';
        cam_radius[2] = '\0';
        cam_radius[3] = '\0';
        cam_radius[4] = '\0';
        cam_radius[5] = '\0';
        cam_radius[6] = '\0';
        cam_radius[7] = '\0';
        cam_frustum[8] = '\0';
        cam_frustum[9] = '\0';
        cam_frustum[10] = '\0';
        cam_frustum[0xb] = '\0';
        cam_frustum[0xc] = '\0';
        cam_frustum[0xd] = '\0';
        cam_frustum[0xe] = '\0';
        cam_frustum[0xf] = '\0';
        cam_frustum[0x10] = '\0';
        cam_frustum[0x11] = '\0';
        cam_frustum[0x12] = '\0';
        cam_frustum[0x13] = '\0';
        cam_frustum[0x14] = '\0';
        cam_frustum[0x15] = '\0';
        cam_frustum[0x16] = '\0';
        cam_frustum[0x17] = '\0';
        cam_fov[0x18] = '\0';
        cam_fov[0x19] = '\0';
        cam_fov[0x1a] = '\0';
        cam_fov[0x1b] = '\0';
        cam_fov[0x1c] = '\0';
        cam_fov[0x1d] = '\0';
        cam_fov[0x1e] = '\0';
        cam_fov[0x1f] = '\0';
        cam_frustum[0] = '\0';
        cam_frustum[1] = '\0';
        cam_frustum[2] = '\0';
        cam_frustum[3] = '\0';
        cam_frustum[4] = '\0';
        cam_frustum[5] = '\0';
        cam_frustum[6] = '\0';
        cam_frustum[7] = '\0';
        cam_fov[8] = '\0';
        cam_fov[9] = '\0';
        cam_fov[10] = '\0';
        cam_fov[0xb] = '\0';
        cam_fov[0xc] = '\0';
        cam_fov[0xd] = '\0';
        cam_fov[0xe] = '\0';
        cam_fov[0xf] = '\0';
        cam_fov[0x10] = '\0';
        cam_fov[0x11] = '\0';
        cam_fov[0x12] = '\0';
        cam_fov[0x13] = '\0';
        cam_fov[0x14] = '\0';
        cam_fov[0x15] = '\0';
        cam_fov[0x16] = '\0';
        cam_fov[0x17] = '\0';
        cam_mode = (char *)0x0;
        cam_fov[0] = '\0';
        cam_fov[1] = '\0';
        cam_fov[2] = '\0';
        cam_fov[3] = '\0';
        cam_fov[4] = '\0';
        cam_fov[5] = '\0';
        cam_fov[6] = '\0';
        cam_fov[7] = '\0';
        snprintf(cam_angle + 0x38,0x40,"%.5f %.5f %.5f",SUB84((double)poVar19->focus[0],0),
                 (double)poVar19->focus[1],(double)poVar19->focus[2]);
        snprintf(cam_radius + 0x18,0x40,"%.5f %.5f %.5f",SUB84((double)poVar19->angle[0],0),
                 (double)poVar19->angle[1],(double)poVar19->angle[2]);
        snprintf(cam_frustum + 0x18,0x20,"%.5f",SUB84((double)poVar19->radius,0));
        snprintf(cam_fov + 0x18,0x20,"%.5f",SUB84((double)poVar19->frustum,0));
        snprintf((char *)&cam_mode,0x20,"%i",(ulong)(uint)poVar19->fov);
        switch(poVar19->mode) {
        default:
          _chunk_size_2 = "pers";
          break;
        case ogt_cam_mode_free:
          _chunk_size_2 = "free";
          break;
        case ogt_cam_mode_pano:
          _chunk_size_2 = "pano";
          break;
        case ogt_cam_mode_orthographic:
          _chunk_size_2 = "orth";
          break;
        case ogt_cam_mode_isometric:
          _chunk_size_2 = "iso";
        }
        rotated_palette.color[0xff] = (ogt_vox_rgba)_vox_file_get_offset(_i);
        _vox_file_write_uint32(_i,0x4d414372);
        _vox_file_write_uint32(_i,0);
        _vox_file_write_uint32(_i,0);
        _vox_file_write_uint32(_i,poVar19->camera_id);
        _vox_file_write_uint32(_i,6);
        _vox_file_write_dict_key_value(_i,"_mode",_chunk_size_2);
        _vox_file_write_dict_key_value(_i,"_focus",cam_angle + 0x38);
        _vox_file_write_dict_key_value(_i,"_angle",cam_radius + 0x18);
        _vox_file_write_dict_key_value(_i,"_radius",cam_frustum + 0x18);
        _vox_file_write_dict_key_value(_i,"_frustum",cam_fov + 0x18);
        _vox_file_write_dict_key_value(_i,"_fov",(char *)&cam_mode);
        uVar16 = _vox_file_get_offset(_i);
        rotated_palette.color[0xfe] =
             (ogt_vox_rgba)((uVar16 - (int)rotated_palette.color[0xff]) + -0xc);
        _vox_file_write_uint32_at_offset
                  (_i,(int)rotated_palette.color[0xff] + 4,
                   (uint32_t *)(rotated_palette.color + 0xfe));
      }
      for (matl._4_4_ = 0; matl._4_4_ < 0x100; matl._4_4_ = matl._4_4_ + 1) {
        *(ogt_vox_rgba *)(&i_5 + matl._4_4_) = (scene->palette).color[matl._4_4_ + 1 & 0xff];
      }
      _vox_file_write_uint32(_i,0x41424752);
      _vox_file_write_uint32(_i,0x400);
      _vox_file_write_uint32(_i,0);
      _vox_file_write(_i,&i_5,0x400);
      for (matl._0_4_ = 0; (int)(uint32_t)matl < 0x100; matl._0_4_ = (uint32_t)matl + 1) {
        poVar20 = (scene->materials).matl + (int)(uint32_t)matl;
        if (poVar20->content_flags != 0) {
          uVar1 = poVar20->content_flags;
          uVar2 = poVar20->content_flags;
          uVar3 = poVar20->content_flags;
          uVar4 = poVar20->content_flags;
          uVar5 = poVar20->content_flags;
          uVar6 = poVar20->content_flags;
          uVar7 = poVar20->content_flags;
          uVar16 = poVar20->content_flags;
          uVar8 = poVar20->content_flags;
          uVar9 = poVar20->content_flags;
          uVar10 = poVar20->content_flags;
          uVar11 = poVar20->content_flags;
          uVar12 = poVar20->content_flags;
          uVar13 = poVar20->content_flags;
          uVar17 = _vox_file_get_offset(_i);
          _vox_file_write_uint32(_i,0x4c54414d);
          _vox_file_write_uint32(_i,0);
          _vox_file_write_uint32(_i,0);
          _vox_file_write_uint32(_i,(uint32_t)matl);
          _vox_file_write_uint32
                    (_i,(uVar1 & 1) + 1 + ((uVar2 & 2) >> 1) + ((uVar3 & 4) >> 2) +
                        ((uVar4 & 8) >> 3) + ((uVar5 & 0x10) >> 4) + ((uVar6 & 0x20) >> 5) +
                        ((uVar7 & 0x40) >> 6) + (uint)(byte)((byte)uVar16 >> 7) +
                        (uint)((uVar8 >> 8 & 1) != 0) + (uint)((uVar9 >> 9 & 1) != 0) +
                        (uint)((uVar10 >> 10 & 1) != 0) + (uint)((uVar11 >> 0xb & 1) != 0) +
                        (uint)((uVar12 >> 0xc & 1) != 0) + (uint)((uVar13 >> 0xd & 1) != 0));
          _vox_file_write_dict_key_value(_i,"_type",ogt_vox_write_scene::type_str[poVar20->type]);
          if ((poVar20->content_flags & 1) != 0) {
            _vox_file_write_dict_key_value_float(_i,"_metal",poVar20->metal);
          }
          if ((poVar20->content_flags & 2) != 0) {
            _vox_file_write_dict_key_value_float(_i,"_rough",poVar20->rough);
          }
          if ((poVar20->content_flags & 4) != 0) {
            _vox_file_write_dict_key_value_float(_i,"_spec",poVar20->spec);
          }
          if ((poVar20->content_flags & 8) != 0) {
            _vox_file_write_dict_key_value_float(_i,"_ior",poVar20->ior);
          }
          if ((poVar20->content_flags & 0x10) != 0) {
            _vox_file_write_dict_key_value_float(_i,"_att",poVar20->att);
          }
          if ((poVar20->content_flags & 0x20) != 0) {
            _vox_file_write_dict_key_value_float(_i,"_flux",poVar20->flux);
          }
          if ((poVar20->content_flags & 0x40) != 0) {
            _vox_file_write_dict_key_value_float(_i,"_emit",poVar20->emit);
          }
          if ((poVar20->content_flags & 0x80) != 0) {
            _vox_file_write_dict_key_value_float(_i,"_ldr",poVar20->ldr);
          }
          if ((poVar20->content_flags & 0x100) != 0) {
            _vox_file_write_dict_key_value_float(_i,"_trans",poVar20->trans);
          }
          if ((poVar20->content_flags & 0x200) != 0) {
            _vox_file_write_dict_key_value_float(_i,"_alpha",poVar20->alpha);
          }
          if ((poVar20->content_flags & 0x400) != 0) {
            _vox_file_write_dict_key_value_float(_i,"_d",poVar20->d);
          }
          if ((poVar20->content_flags & 0x800) != 0) {
            _vox_file_write_dict_key_value_float(_i,"_sp",poVar20->sp);
          }
          if ((poVar20->content_flags & 0x1000) != 0) {
            _vox_file_write_dict_key_value_float(_i,"_g",poVar20->g);
          }
          if ((poVar20->content_flags & 0x2000) != 0) {
            _vox_file_write_dict_key_value_float(_i,"_media",poVar20->media);
          }
          uVar16 = _vox_file_get_offset(_i);
          color_string._60_4_ = (uVar16 - uVar17) + -0xc;
          _vox_file_write_uint32_at_offset(_i,uVar17 + 4,(uint32_t *)(color_string + 0x3c));
        }
      }
      color_string[0x38] = '\0';
      color_string[0x39] = '\0';
      color_string[0x3a] = '\0';
      color_string[0x3b] = '\0';
      for (; (uint)color_string._56_4_ < scene->num_layers;
          color_string._56_4_ = color_string._56_4_ + 1) {
        poVar14 = scene->layers;
        uVar21 = (ulong)(uint)color_string._56_4_;
        snprintf((char *)&layer_name_string,0x40,"%u %u %u",(ulong)poVar14[uVar21].color.r,
                 (ulong)poVar14[uVar21].color.g,(ulong)poVar14[uVar21].color.b);
        _offset_of_chunk_header_4 = (char *)0x0;
        hidden_string_1 = scene->layers[(uint)color_string._56_4_].name;
        if ((scene->layers[(uint)color_string._56_4_].hidden & 1U) != 0) {
          _offset_of_chunk_header_4 = "1";
        }
        chunk_size_4 = (-(uint)(_offset_of_chunk_header_4 == (char *)0x0) -
                       (uint)(hidden_string_1 == (char *)0x0)) + 3;
        local_690 = _vox_file_get_offset(_i);
        _vox_file_write_uint32(_i,0x5259414c);
        _vox_file_write_uint32(_i,0);
        _vox_file_write_uint32(_i,0);
        _vox_file_write_uint32(_i,color_string._56_4_);
        _vox_file_write_uint32(_i,chunk_size_4);
        _vox_file_write_dict_key_value(_i,"_name",hidden_string_1);
        _vox_file_write_dict_key_value(_i,"_hidden",_offset_of_chunk_header_4);
        _vox_file_write_dict_key_value(_i,"_color",(char *)&layer_name_string);
        _vox_file_write_uint32(_i,0xffffffff);
        uVar16 = _vox_file_get_offset(_i);
        buffer_data._4_4_ = (uVar16 - local_690) + -0xc;
        _vox_file_write_uint32_at_offset(_i,local_690 + 4,(uint32_t *)((long)&buffer_data + 4));
      }
      if ((0xffffffff < (_i->data).count) || (0xffffffff < (_i->data).count - (ulong)model._4_4_)) {
        __assert_fail("(0) && (\"Generated file size exceeded 4GiB, which is too large for Magicavoxel to parse.\")"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                      ,0xabe,"uint8_t *ogt_vox_write_scene(const ogt_vox_scene *, uint32_t *)");
      }
      *(int *)file.data.count = (int)(_i->data).count;
      scene_local = (ogt_vox_scene *)_vox_file_get_data(_i);
      (_i->data).data = (uchar *)0x0;
      *(uint32_t *)((long)((scene_local->palette).color + -0xd) + (ulong)model._4_4_) =
           *(int *)file.data.count - model._4_4_;
      if (g_progress_callback_func != (ogt_vox_progress_callback_func)0x0) {
        (*g_progress_callback_func)(1.0,g_progress_callback_user_data);
      }
LAB_0010b05c:
      first_group_node_id = 1;
      _vox_file_writeable::~_vox_file_writeable((_vox_file_writeable *)local_38);
      return (uint8_t *)scene_local;
    }
    _num_solid_voxels = scene->models[(uint)model];
    bVar15 = false;
    if (((_num_solid_voxels->size_x < 0x101) && (bVar15 = false, _num_solid_voxels->size_y < 0x101))
       && (bVar15 = false, _num_solid_voxels->size_z < 0x101)) {
      bVar15 = true;
    }
    if (!bVar15) {
      __assert_fail("(model->size_x <= 256 && model->size_y <= 256 && model->size_z <= 256) && (\"model dimensions exceed the limit of 256x256x256\")"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                    ,0x96d,"uint8_t *ogt_vox_write_scene(const ogt_vox_scene *, uint32_t *)");
    }
    voxel_index_1 =
         _num_solid_voxels->size_x * _num_solid_voxels->size_y * _num_solid_voxels->size_z;
    chunk_size_xyzi = 0;
    for (voxel_index = 0; voxel_index < voxel_index_1; voxel_index = voxel_index + 1) {
      if (_num_solid_voxels->voxel_data[voxel_index] != '\0') {
        chunk_size_xyzi = chunk_size_xyzi + 1;
      }
    }
    z = chunk_size_xyzi * 4 + 4;
    _vox_file_write_uint32(_i,0x455a4953);
    _vox_file_write_uint32(_i,0xc);
    _vox_file_write_uint32(_i,0);
    bVar15 = false;
    if (((_num_solid_voxels->size_x != 0) && (bVar15 = false, _num_solid_voxels->size_y != 0)) &&
       (bVar15 = false, _num_solid_voxels->size_z != 0)) {
      bVar15 = true;
    }
    if (!bVar15) {
      __assert_fail("(model->size_x && model->size_y && model->size_z) && (\"model has zero size\")"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                    ,0x97c,"uint8_t *ogt_vox_write_scene(const ogt_vox_scene *, uint32_t *)");
    }
    _vox_file_write_uint32(_i,_num_solid_voxels->size_x);
    _vox_file_write_uint32(_i,_num_solid_voxels->size_y);
    _vox_file_write_uint32(_i,_num_solid_voxels->size_z);
    _vox_file_write_uint32(_i,0x495a5958);
    _vox_file_write_uint32(_i,z);
    _vox_file_write_uint32(_i,0);
    _vox_file_write_uint32(_i,chunk_size_xyzi);
    y = 0;
    for (x = 0; x < _num_solid_voxels->size_z; x = x + 1) {
      for (_uStack_7c = 0; _uStack_7c < _num_solid_voxels->size_y; _uStack_7c = _uStack_7c + 1) {
        for (local_80 = 0; local_80 < _num_solid_voxels->size_x; local_80 = local_80 + 1) {
          first_group_transform_node_id._3_1_ = _num_solid_voxels->voxel_data[y];
          if (first_group_transform_node_id._3_1_ != '\0') {
            _vox_file_write_uint8(_i,(uint8_t)local_80);
            _vox_file_write_uint8(_i,uStack_7c);
            _vox_file_write_uint8(_i,(uint8_t)x);
            _vox_file_write_uint8(_i,first_group_transform_node_id._3_1_);
          }
          y = y + 1;
        }
      }
    }
    if ((g_progress_callback_func != (ogt_vox_progress_callback_func)0x0) &&
       (bVar15 = (*g_progress_callback_func)
                           ((float)((uint)model + 1) / (float)(scene->num_models + 1),
                            g_progress_callback_user_data), !bVar15)) {
      *(undefined4 *)file.data.count = 0;
      scene_local = (ogt_vox_scene *)0x0;
      goto LAB_0010b05c;
    }
    model._0_4_ = (uint)model + 1;
  } while( true );
}

Assistant:

uint8_t* ogt_vox_write_scene(const ogt_vox_scene* scene, uint32_t* buffer_size) {
        _vox_file_writeable file;
        _vox_file_writeable_init(&file);
        _vox_file_writeable* fp = &file;

        // write file header and file version
        _vox_file_write_uint32(fp, CHUNK_ID_VOX_);
        _vox_file_write_uint32(fp, 150);

        // write the main chunk
        _vox_file_write_uint32(fp, CHUNK_ID_MAIN);
        _vox_file_write_uint32(fp, 0);
        _vox_file_write_uint32(fp, 0);  // this main_chunk_child_size will get patched up once everything is written.

        // we need to know how to patch up the main chunk size after we've written everything
        const uint32_t offset_post_main_chunk = _vox_file_get_offset(fp);

        // write out all model chunks
        for (uint32_t i = 0; i < scene->num_models; i++) {
            const ogt_vox_model* model = scene->models[i];
            ogt_assert(model->size_x <= 256 && model->size_y <= 256 && model->size_z <= 256, "model dimensions exceed the limit of 256x256x256");
            // count the number of solid voxels in the grid
            uint32_t num_voxels_in_grid = model->size_x * model->size_y * model->size_z;
            uint32_t num_solid_voxels = 0;
            for (uint32_t voxel_index = 0; voxel_index < num_voxels_in_grid; voxel_index++)
                if (model->voxel_data[voxel_index] != 0)
                    num_solid_voxels++;
            uint32_t chunk_size_xyzi = sizeof(uint32_t) + 4 * num_solid_voxels;

            // write the SIZE chunk header
            _vox_file_write_uint32(fp, CHUNK_ID_SIZE);
            _vox_file_write_uint32(fp, 12);
            _vox_file_write_uint32(fp, 0);

            // write the SIZE chunk payload
            ogt_assert(model->size_x && model->size_y && model->size_z, "model has zero size");
            _vox_file_write_uint32(fp, model->size_x);
            _vox_file_write_uint32(fp, model->size_y);
            _vox_file_write_uint32(fp, model->size_z);

            // write the XYZI chunk header
            _vox_file_write_uint32(fp, CHUNK_ID_XYZI);
            _vox_file_write_uint32(fp, chunk_size_xyzi);
            _vox_file_write_uint32(fp, 0);

            // write out XYZI chunk payload
            _vox_file_write_uint32(fp, num_solid_voxels);
            uint32_t voxel_index = 0;
            for (uint32_t z = 0; z < model->size_z; z++) {
                for (uint32_t y = 0; y < model->size_y; y++) {
                    for (uint32_t x = 0; x < model->size_x; x++, voxel_index++) {
                        uint8_t color_index = model->voxel_data[voxel_index];
                        if (color_index != 0) {
                            _vox_file_write_uint8(fp, (uint8_t)x);
                            _vox_file_write_uint8(fp, (uint8_t)y);
                            _vox_file_write_uint8(fp, (uint8_t)z);
                            _vox_file_write_uint8(fp, color_index);
                        }
                    }
                }
            }

            if (g_progress_callback_func) {
                // we indicate progress as number of models written, with an extra progress value for ending write
                if (!g_progress_callback_func((float)(i + 1)/(float)(scene->num_models + 1), g_progress_callback_user_data))
                {
                    *buffer_size = 0;
                    return NULL; // note: fp will be freed in dtor on exit
                }
            }
        }

        // define our node_id ranges.
        ogt_assert(scene->num_groups > 0, "no groups found in scene");
        uint32_t first_group_transform_node_id    = 0;
        uint32_t first_group_node_id              = first_group_transform_node_id + scene->num_groups;
        uint32_t first_shape_node_id              = first_group_node_id + scene->num_groups;
        uint32_t first_instance_transform_node_id = first_shape_node_id + scene->num_instances;

        // write the nTRN nodes for each of the groups in the scene.
        for (uint32_t group_index = 0; group_index < scene->num_groups; group_index++) {
            const ogt_vox_group* group = &scene->groups[group_index];
            _vox_file_write_chunk_nTRN(fp, first_group_transform_node_id + group_index, first_group_node_id + group_index, group->name, group->hidden, &group->transform, group->layer_index, &group->transform_anim);
        }
        // write the group nodes for each of the groups in the scene
        for (uint32_t group_index = 0; group_index < scene->num_groups; group_index++) {
            // count how many childnodes  there are. This is simply the sum of all
            // groups and instances that have this group as its parent
            uint32_t num_child_nodes = 0;
            for (uint32_t child_group_index = 0; child_group_index < scene->num_groups; child_group_index++)
                if (scene->groups[child_group_index].parent_group_index == group_index)
                    num_child_nodes++;
            for (uint32_t child_instance_index = 0; child_instance_index < scene->num_instances; child_instance_index++)
                if (scene->instances[child_instance_index].group_index == group_index)
                    num_child_nodes++;

            // count number of dictionary items
            const char* hidden_string = scene->groups[group_index].hidden ? "1" : NULL;
            uint32_t group_dict_keyvalue_count = (hidden_string ? 1 : 0);

            // compute the chunk size.
            uint32_t offset_of_chunk_header = _vox_file_get_offset(fp);

            // write the nGRP header
            _vox_file_write_uint32(fp, CHUNK_ID_nGRP);
            _vox_file_write_uint32(fp, 0); // chunk_size will get patched up after.
            _vox_file_write_uint32(fp, 0);
            // write the nGRP payload
            _vox_file_write_uint32(fp, first_group_node_id + group_index);       // node_id
            _vox_file_write_uint32(fp, group_dict_keyvalue_count); // num keyvalue pairs in node dictionary
            _vox_file_write_dict_key_value(fp, "_hidden", hidden_string);
            _vox_file_write_uint32(fp, num_child_nodes);
            // write the child group transform nodes
            for (uint32_t child_group_index = 0; child_group_index < scene->num_groups; child_group_index++)
                if (scene->groups[child_group_index].parent_group_index == group_index)
                    _vox_file_write_uint32(fp, first_group_transform_node_id + child_group_index);
            // write the child instance transform nodes
            for (uint32_t child_instance_index = 0; child_instance_index < scene->num_instances; child_instance_index++)
                if (scene->instances[child_instance_index].group_index == group_index)
                    _vox_file_write_uint32(fp, first_instance_transform_node_id + child_instance_index);

            uint32_t chunk_size = _vox_file_get_offset(fp) - offset_of_chunk_header - CHUNK_HEADER_LEN;
            _vox_file_write_uint32_at_offset(fp, offset_of_chunk_header + 4, &chunk_size);
        }

        // write out an nSHP chunk for each of the instances
        for (uint32_t i = 0; i < scene->num_instances; i++) {
            const ogt_vox_instance* instance = &scene->instances[i];

            uint32_t offset_of_chunk_header = _vox_file_get_offset(fp);
            // write the nSHP chunk header
            _vox_file_write_uint32(fp, CHUNK_ID_nSHP);
            _vox_file_write_uint32(fp, 0); // will get patched up at the end
            _vox_file_write_uint32(fp, 0);
            // write the nSHP chunk payload
            _vox_file_write_uint32(fp, first_shape_node_id + i);    // node_id

            // write the nSHP node dictionary
            const char* loop_string = instance->model_anim.loop ? "1" : NULL;
            uint32_t node_dict_keyvalue_count = (loop_string ? 1 : 0);
            _vox_file_write_uint32(fp, node_dict_keyvalue_count);  // num key values
            _vox_file_write_dict_key_value(fp, "_loop",   loop_string);

            if (instance->model_anim.num_keyframes == 0 ) {
                _vox_file_write_uint32(fp, 1);                      // num_models must be 1
                _vox_file_write_uint32(fp, instance->model_index);  // model_id
                _vox_file_write_uint32(fp, 0);                      // num keyvalue pairs in model dictionary
            }
            else {
                _vox_file_write_uint32(fp, instance->model_anim.num_keyframes);
                for (uint32_t j = 0; j < instance->model_anim.num_keyframes; j++) {
                    _vox_file_write_uint32(fp, instance->model_anim.keyframes[j].model_index); // model_id
                    _vox_file_write_uint32(fp, 1); // num keyvalue pairs in model dictionary
                    _vox_file_write_dict_key_value_uint32(fp, "_f", instance->model_anim.keyframes[j].frame_index);
                }
            }
            // compute and patch up the chunk size in the chunk header
            uint32_t chunk_size = _vox_file_get_offset(fp) - offset_of_chunk_header - CHUNK_HEADER_LEN;
            _vox_file_write_uint32_at_offset(fp, offset_of_chunk_header + 4, &chunk_size);
        }

        // write out a nTRN chunk for all instances - and make them point to the relevant nSHP chunk
        for (uint32_t i = 0; i < scene->num_instances; i++) {
            const ogt_vox_instance* instance = &scene->instances[i];
            uint32_t node_id       = first_instance_transform_node_id + i;
            uint32_t child_node_id = first_shape_node_id + i;
            _vox_file_write_chunk_nTRN(fp, node_id, child_node_id, instance->name, instance->hidden, &instance->transform, instance->layer_index, &instance->transform_anim);
        }

        // write out the rCAM chunks
        for (uint32_t i = 0; i < scene->num_cameras; i++) {
            const ogt_vox_cam* camera = &scene->cameras[i];
            char cam_focus[64] = "";
            char cam_angle[64] = "";
            char cam_radius[32] = "";
            char cam_frustum[32] = "";
            char cam_fov[32] = "";
            const char *cam_mode;
            _vox_sprintf(cam_focus, sizeof(cam_focus), "%.5f %.5f %.5f", camera->focus[0], camera->focus[1], camera->focus[2]);
            _vox_sprintf(cam_angle, sizeof(cam_angle), "%.5f %.5f %.5f", camera->angle[0], camera->angle[1], camera->angle[2]);
            _vox_sprintf(cam_radius, sizeof(cam_radius), "%.5f", camera->radius);
            _vox_sprintf(cam_frustum, sizeof(cam_frustum), "%.5f", camera->frustum);
            _vox_sprintf(cam_fov, sizeof(cam_fov), "%i", camera->fov);

            switch (camera->mode) {
            case ogt_cam_mode_free:
                cam_mode = "free";
                break;
            case ogt_cam_mode_pano:
                cam_mode = "pano";
                break;
            case ogt_cam_mode_isometric:
                cam_mode = "iso";
                break;
            case ogt_cam_mode_orthographic:
                cam_mode = "orth";
                break;
            default:
            case ogt_cam_mode_unknown:
            case ogt_cam_mode_perspective:
                cam_mode = "pers";
                break;
            }

            uint32_t offset_of_chunk_header = _vox_file_get_offset(fp);

            // write the rCAM header
            _vox_file_write_uint32(fp, CHUNK_ID_rCAM);
            _vox_file_write_uint32(fp, 0); // chunk_size will get patched up later
            _vox_file_write_uint32(fp, 0);

            _vox_file_write_uint32(fp, camera->camera_id);
            _vox_file_write_uint32(fp, 6);  // num key values
            _vox_file_write_dict_key_value(fp, "_mode", cam_mode);
            _vox_file_write_dict_key_value(fp, "_focus", cam_focus);
            _vox_file_write_dict_key_value(fp, "_angle", cam_angle);
            _vox_file_write_dict_key_value(fp, "_radius", cam_radius);
            _vox_file_write_dict_key_value(fp, "_frustum", cam_frustum);
            _vox_file_write_dict_key_value(fp, "_fov", cam_fov);

            // compute and patch up the chunk size in the chunk header
            uint32_t chunk_size = _vox_file_get_offset(fp) - offset_of_chunk_header - CHUNK_HEADER_LEN;
            _vox_file_write_uint32_at_offset(fp, offset_of_chunk_header + 4, &chunk_size);
        }

        // write out RGBA chunk for the palette
        {
            // .vox stores palette rotated by 1 color index, so do that now.
            ogt_vox_palette rotated_palette;
            for (uint32_t i = 0; i < 256; i++)
                rotated_palette.color[i] = scene->palette.color[(i + 1) & 255];

            // write the palette chunk header
            _vox_file_write_uint32(fp, CHUNK_ID_RGBA);
            _vox_file_write_uint32(fp, sizeof(ogt_vox_palette));
            _vox_file_write_uint32(fp, 0);
            // write the palette chunk payload
            _vox_file_write(fp, &rotated_palette, sizeof(ogt_vox_palette));
        }

        // write out MATL chunk
        {
            // keep in sync with ogt_matl_type
            static const char *type_str[] = {"_diffuse", "_metal", "_glass", "_emit", "_blend", "_media"};

            for (int32_t i = 0; i < 256; ++i) {
                const ogt_vox_matl &matl = scene->materials.matl[i];
                if (matl.content_flags == 0u) {
                    continue;
                }
                uint32_t matl_dict_keyvalue_count = 1;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_metal) ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_rough) ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_spec)  ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_ior)   ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_att)   ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_flux)  ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_emit)  ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_ldr)   ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_trans) ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_alpha) ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_d)     ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_sp)    ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_g)     ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_media) ? 1 : 0;

                uint32_t offset_of_chunk_header = _vox_file_get_offset(fp);

                // write the material chunk header
                _vox_file_write_uint32(fp, CHUNK_ID_MATL);
                _vox_file_write_uint32(fp, 0); // chunk_size will get patched up later
                _vox_file_write_uint32(fp, 0);

                _vox_file_write_uint32(fp, i); // material id
                _vox_file_write_uint32(fp, matl_dict_keyvalue_count);
                _vox_file_write_dict_key_value(fp, "_type", type_str[matl.type]);
                if (matl.content_flags & k_ogt_vox_matl_have_metal) {
                    _vox_file_write_dict_key_value_float(fp, "_metal", matl.metal);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_rough) {
                    _vox_file_write_dict_key_value_float(fp, "_rough", matl.rough);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_spec) {
                    _vox_file_write_dict_key_value_float(fp, "_spec", matl.spec);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_ior) {
                    _vox_file_write_dict_key_value_float(fp, "_ior", matl.ior);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_att) {
                    _vox_file_write_dict_key_value_float(fp, "_att", matl.att);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_flux) {
                    _vox_file_write_dict_key_value_float(fp, "_flux", matl.flux);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_emit) {
                    _vox_file_write_dict_key_value_float(fp, "_emit", matl.emit);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_ldr) {
                    _vox_file_write_dict_key_value_float(fp, "_ldr", matl.ldr);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_trans) {
                    _vox_file_write_dict_key_value_float(fp, "_trans", matl.trans);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_alpha) {
                    _vox_file_write_dict_key_value_float(fp, "_alpha", matl.alpha);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_d) {
                    _vox_file_write_dict_key_value_float(fp, "_d", matl.d);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_sp) {
                    _vox_file_write_dict_key_value_float(fp, "_sp", matl.sp);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_g) {
                    _vox_file_write_dict_key_value_float(fp, "_g", matl.g);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_media) {
                    _vox_file_write_dict_key_value_float(fp, "_media", matl.media);
                }
                // compute and patch up the chunk size in the chunk header
                uint32_t chunk_size = _vox_file_get_offset(fp) - offset_of_chunk_header - CHUNK_HEADER_LEN;
                _vox_file_write_uint32_at_offset(fp, offset_of_chunk_header + 4, &chunk_size);
            }
        }

        // write all layer chunks out.
        for (uint32_t i = 0; i < scene->num_layers; i++) {
            char color_string[64];
            _vox_sprintf(color_string, sizeof(color_string), "%u %u %u", scene->layers[i].color.r, scene->layers[i].color.g, scene->layers[i].color.b);
            const char* layer_name_string = scene->layers[i].name;
            const char* hidden_string = scene->layers[i].hidden ? "1" : NULL;
            uint32_t layer_dict_keyvalue_count = 0;
            layer_dict_keyvalue_count += (layer_name_string ? 1 : 0);
            layer_dict_keyvalue_count += (hidden_string ? 1 : 0);
            layer_dict_keyvalue_count += 1; // color_string

            uint32_t offset_of_chunk_header = _vox_file_get_offset(fp);

            // write the layer chunk header
            _vox_file_write_uint32(fp, CHUNK_ID_LAYR);
            _vox_file_write_uint32(fp, 0); // chunk_size will get patched up later
            _vox_file_write_uint32(fp, 0);
            // write the layer chunk payload
            _vox_file_write_uint32(fp, i);                          // layer_id
            _vox_file_write_uint32(fp, layer_dict_keyvalue_count);  // num keyvalue pairs in layer dictionary
            _vox_file_write_dict_key_value(fp, "_name",   layer_name_string);
            _vox_file_write_dict_key_value(fp, "_hidden", hidden_string);
            _vox_file_write_dict_key_value(fp, "_color",  color_string);
            _vox_file_write_uint32(fp, UINT32_MAX);                 // reserved id

            // compute and patch up the chunk size in the chunk header
            uint32_t chunk_size = _vox_file_get_offset(fp) - offset_of_chunk_header - CHUNK_HEADER_LEN;
            _vox_file_write_uint32_at_offset(fp, offset_of_chunk_header + 4, &chunk_size);
        }

        // check that the buffer is not larger than the maximum file size, return nothing if would overflow
        if (fp->data.count > UINT32_MAX ||  (fp->data.count - offset_post_main_chunk) > UINT32_MAX)
        {
            ogt_assert(0, "Generated file size exceeded 4GiB, which is too large for Magicavoxel to parse.");
            *buffer_size = 0;
            return NULL;  // note: fp will be freed in dtor on exit
        }

        // we deliberately don't free the fp->data field, just pass the buffer pointer and size out to the caller
        *buffer_size = (uint32_t)fp->data.count;
        uint8_t* buffer_data = _vox_file_get_data(fp);
        // we deliberately clear this pointer so it doesn't get auto-freed on exiting. The caller will own the memory hereafter.
        fp->data.data = NULL;

        // patch up the main chunk's child chunk size now that we've written everything we're going to write.
        {
            uint32_t* main_chunk_child_size = (uint32_t*)& buffer_data[offset_post_main_chunk - sizeof(uint32_t)];
            *main_chunk_child_size = *buffer_size - offset_post_main_chunk;
        }

        if (g_progress_callback_func) {
            // we indicate progress as number of models written, with an extra progress value for ending write
            g_progress_callback_func(1.0f,g_progress_callback_user_data); // we ignore the return as exiting here anyway
        }

        return buffer_data;
    }